

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3RenameMethod(sqlite3_vtab *pVtab,char *zName)

{
  sqlite3 *db;
  int iVar1;
  int rc;
  int local_24;
  
  db = (sqlite3 *)pVtab[1].pModule;
  iVar1 = fts3SetHasStat((Fts3Table *)pVtab);
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts3PendingTermsFlush((Fts3Table *)pVtab);
  }
  if (*(long *)&pVtab[3].nRef == 0) {
    fts3DbExec(&local_24,db,"ALTER TABLE %Q.\'%q_content\'  RENAME TO \'%q_content\';",
               *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  }
  if (*(char *)((long)&pVtab[0x12].zErrMsg + 6) != '\0') {
    fts3DbExec(&local_24,db,"ALTER TABLE %Q.\'%q_docsize\'  RENAME TO \'%q_docsize\';",
               *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  }
  if (*(char *)((long)&pVtab[0x12].zErrMsg + 5) != '\0') {
    fts3DbExec(&local_24,db,"ALTER TABLE %Q.\'%q_stat\'  RENAME TO \'%q_stat\';",
               *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  }
  fts3DbExec(&local_24,db,"ALTER TABLE %Q.\'%q_segments\' RENAME TO \'%q_segments\';",
             *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  fts3DbExec(&local_24,db,"ALTER TABLE %Q.\'%q_segdir\'   RENAME TO \'%q_segdir\';",
             *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  return iVar1;
}

Assistant:

static int fts3RenameMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  const char *zName               /* New name of table */
){
  Fts3Table *p = (Fts3Table *)pVtab;
  sqlite3 *db = p->db;            /* Database connection */
  int rc;                         /* Return Code */

  /* At this point it must be known if the %_stat table exists or not.
  ** So bHasStat may not be 2.  */
  rc = fts3SetHasStat(p);
  
  /* As it happens, the pending terms table is always empty here. This is
  ** because an "ALTER TABLE RENAME TABLE" statement inside a transaction 
  ** always opens a savepoint transaction. And the xSavepoint() method 
  ** flushes the pending terms table. But leave the (no-op) call to
  ** PendingTermsFlush() in in case that changes.
  */
  assert( p->nPendingData==0 );
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3PendingTermsFlush(p);
  }

  if( p->zContentTbl==0 ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_content'  RENAME TO '%q_content';",
      p->zDb, p->zName, zName
    );
  }

  if( p->bHasDocsize ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_docsize'  RENAME TO '%q_docsize';",
      p->zDb, p->zName, zName
    );
  }
  if( p->bHasStat ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_stat'  RENAME TO '%q_stat';",
      p->zDb, p->zName, zName
    );
  }
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segments' RENAME TO '%q_segments';",
    p->zDb, p->zName, zName
  );
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segdir'   RENAME TO '%q_segdir';",
    p->zDb, p->zName, zName
  );
  return rc;
}